

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

QString * __thiscall QString::setNum(QString *this,qulonglong n,int base)

{
  QArrayData *data;
  char16_t *pcVar1;
  qsizetype qVar2;
  long in_FS_OFFSET;
  QString local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  qulltoBasicLatin(&local_38,n,base,false);
  data = &((this->d).d)->super_QArrayData;
  pcVar1 = (this->d).ptr;
  (this->d).d = local_38.d.d;
  (this->d).ptr = local_38.d.ptr;
  qVar2 = (this->d).size;
  (this->d).size = local_38.d.size;
  local_38.d.d = (Data *)data;
  local_38.d.ptr = pcVar1;
  local_38.d.size = qVar2;
  if (data != (QArrayData *)0x0) {
    LOCK();
    (data->ref_)._q_value.super___atomic_base<int>._M_i =
         (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(data,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QString &QString::setNum(qulonglong n, int base)
{
    return *this = number(n, base);
}